

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateFastInlineStringCodePointAt
          (Lowerer *this,Instr *lastInstr,Func *func,Opnd *strLength,Opnd *srcIndex,
          RegOpnd *lowerChar,RegOpnd *strPtr)

{
  IRType IVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  LabelInstr *target;
  RegOpnd *indexOpnd;
  IntConstOpnd *pIVar8;
  IndirOpnd *src;
  char *message;
  char *error;
  uint lineNumber;
  Lowerer *pLVar9;
  
  if ((strLength->m_type != TyInt64) && (strLength->m_type != TyUint32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d3a,
                       "(strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg)",
                       "strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg");
    if (!bVar4) goto LAB_005e2e50;
    *puVar6 = 0;
  }
  if ((srcIndex->m_type != TyVar) && (OVar5 = IR::Opnd::GetKind(srcIndex), OVar5 != OpndKindAddr)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d3b,"(srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd())",
                       "srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd()");
    if (!bVar4) goto LAB_005e2e50;
    *puVar6 = 0;
  }
  IVar1 = (lowerChar->super_Opnd).m_type;
  if ((IVar1 != TyInt64) && (IVar1 != TyUint32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d3c,
                       "(lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32)",
                       "lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32");
    if (!bVar4) goto LAB_005e2e50;
    *puVar6 = 0;
  }
  OVar5 = IR::Opnd::GetKind(&strPtr->super_Opnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d3d,"(strPtr->IsRegOpnd())","strPtr->IsRegOpnd()");
    if (!bVar4) goto LAB_005e2e50;
    *puVar6 = 0;
  }
  pRVar7 = IR::RegOpnd::New(TyInt64,func);
  target = IR::LabelInstr::New(Label,func,false);
  OVar5 = IR::Opnd::GetKind(srcIndex);
  if (OVar5 != OpndKindAddr) {
    InsertMove(&pRVar7->super_Opnd,srcIndex,lastInstr,true);
    indexOpnd = (RegOpnd *)IR::Opnd::UseWithNewType(&pRVar7->super_Opnd,TyInt32,func);
    InsertMove(&pRVar7->super_Opnd,(Opnd *)indexOpnd,lastInstr,true);
    OVar5 = IR::Opnd::GetKind((Opnd *)indexOpnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005e2e50;
      *puVar6 = 0;
    }
    pIVar8 = IR::IntConstOpnd::New(1,TyInt32,func,false);
    pLVar9 = (Lowerer *)0x0;
    InsertAdd(false,(Opnd *)indexOpnd,(Opnd *)indexOpnd,&pIVar8->super_Opnd,lastInstr);
    InsertCompareBranch(pLVar9,strLength,(Opnd *)indexOpnd,BrLe_A,true,target,lastInstr,false);
    if (TySize[(indexOpnd->super_Opnd).m_type] != 8) {
      indexOpnd = (RegOpnd *)IR::Opnd::UseWithNewType((Opnd *)indexOpnd,TyUint64,func);
      OVar5 = IR::Opnd::GetKind((Opnd *)indexOpnd);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005e2e50;
        *puVar6 = 0;
      }
    }
    src = IR::IndirOpnd::New(strPtr,indexOpnd,'\x01',TyUint16,func);
    goto LAB_005e2cb2;
  }
  OVar5 = IR::Opnd::GetKind(srcIndex);
  if (OVar5 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar4) goto LAB_005e2e50;
    *puVar6 = 0;
  }
  pp_Var2 = srcIndex[2]._vptr_Opnd;
  if (((ulong)pp_Var2 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pp_Var2 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pp_Var2 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x51;
      goto LAB_005e2b9f;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_005e2b9f:
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,lineNumber,error,message);
    if (!bVar4) {
LAB_005e2e50:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pLVar9 = (Lowerer *)(ulong)((int)pp_Var2 + 1);
  pIVar8 = IR::IntConstOpnd::New((IntConstType)pLVar9,TyUint32,func,false);
  InsertCompareBranch(pLVar9,strLength,&pIVar8->super_Opnd,BrLe_A,true,target,lastInstr,false);
  src = IR::IndirOpnd::New(strPtr,(int)pp_Var2 * 2 + 2,TyUint16,func,false);
LAB_005e2cb2:
  pLVar9 = (Lowerer *)0xdc00;
  pIVar8 = IR::IntConstOpnd::New(0xdc00,TyUint32,func,false);
  InsertCompareBranch(pLVar9,&lowerChar->super_Opnd,&pIVar8->super_Opnd,BrGe_A,false,target,
                      lastInstr,false);
  pLVar9 = (Lowerer *)0xd7ff;
  pIVar8 = IR::IntConstOpnd::New(0xd7ff,TyUint32,func,false);
  InsertCompareBranch(pLVar9,&lowerChar->super_Opnd,&pIVar8->super_Opnd,BrLe_A,false,target,
                      lastInstr,false);
  pRVar7 = IR::RegOpnd::New(TyInt32,func);
  InsertMove(&pRVar7->super_Opnd,&src->super_Opnd,lastInstr,true);
  pLVar9 = (Lowerer *)0xe000;
  pIVar8 = IR::IntConstOpnd::New(0xe000,TyUint32,func,false);
  InsertCompareBranch(pLVar9,&pRVar7->super_Opnd,&pIVar8->super_Opnd,BrGe_A,false,target,lastInstr,
                      false);
  pLVar9 = (Lowerer *)0xdbff;
  pIVar8 = IR::IntConstOpnd::New(0xdbff,TyUint32,func,false);
  InsertCompareBranch(pLVar9,&pRVar7->super_Opnd,&pIVar8->super_Opnd,BrLe_A,false,target,lastInstr,
                      false);
  pIVar8 = IR::IntConstOpnd::New(0xd800,TyUint32,func,false);
  InsertSub(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar8->super_Opnd,lastInstr);
  pIVar8 = IR::IntConstOpnd::New(10,TyUint32,func,false);
  InsertShift(Shl_A,false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar8->super_Opnd,
              lastInstr);
  InsertAdd(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pRVar7->super_Opnd,lastInstr);
  pIVar8 = IR::IntConstOpnd::New(0x2400,TyUint32,func,false);
  InsertAdd(false,&lowerChar->super_Opnd,&lowerChar->super_Opnd,&pIVar8->super_Opnd,lastInstr);
  IR::Instr::InsertBefore(lastInstr,&target->super_Instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineStringCodePointAt(IR::Instr* lastInstr, Func* func, IR::Opnd *strLength, IR::Opnd *srcIndex, IR::RegOpnd *lowerChar, IR::RegOpnd *strPtr)
{
    //// Required State:
    // strLength - UInt32
    // srcIndex  - TyVar if not Address
    // lowerChar - TyMachReg
    // strPtr    - Addr
    //// Instructions
    //                  CMP [strLength], srcIndex + 1
    //                  JBE charCodeAt
    //                  CMP lowerChar 0xDC00
    //                  JGE charCodeAt
    //                  CMP lowerChar 0xD7FF
    //                  JLE charCodeAt
    // upperChar      = MOVZX [strPtr + srcIndex + 1]
    //                  CMP upperChar 0xE000
    //                  JGE charCodeAt
    //                  CMP lowerChar 0xDBFF
    //                  JLE charCodeAt
    // lowerChar      = SUB lowerChar - 0xD800
    // lowerChar      = SHL lowerChar, 10
    // lowerChar      = ADD lowerChar + upperChar
    // lowerChar      = ADD lowerChar + 0x2400
    // :charCodeAt
    // :done

    // Asserts
    // Arm should change to Uint32 for the strLength
    Assert(strLength->GetType() == TyUint32 || strLength->GetType() == TyMachReg);
    Assert(srcIndex->GetType() == TyVar || srcIndex->IsAddrOpnd());
    Assert(lowerChar->GetType() == TyMachReg || lowerChar->GetType() == TyUint32);
    Assert(strPtr->IsRegOpnd());

    IR::RegOpnd *tempReg = IR::RegOpnd::New(TyMachReg, func);
    IR::LabelInstr *labelCharCodeAt = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::IndirOpnd *tempIndirOpnd;

    if (srcIndex->IsAddrOpnd())
    {
        uint32 length = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address) + 1U;
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(length, TyUint32, func), Js::OpCode::BrLe_A, true, labelCharCodeAt, lastInstr);
        tempIndirOpnd = IR::IndirOpnd::New(strPtr, (length) * sizeof(char16), TyUint16, func);
    }
    else
    {
        InsertMove(tempReg, srcIndex, lastInstr);

#if INT32VAR
        IR::Opnd * reg32Bit = tempReg->UseWithNewType(TyInt32, func);
        InsertMove(tempReg, reg32Bit, lastInstr);
        tempReg = reg32Bit->AsRegOpnd();
#else
        InsertShift(Js::OpCode::Shr_A, false, tempReg, tempReg, IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, func), lastInstr);
#endif
        InsertAdd(false, tempReg, tempReg, IR::IntConstOpnd::New(1, TyInt32, func), lastInstr);

        InsertCompareBranch(strLength, tempReg, Js::OpCode::BrLe_A, true, labelCharCodeAt, lastInstr);

        if(tempReg->GetSize() != MachPtr)
        {
            tempReg = tempReg->UseWithNewType(TyMachPtr, func)->AsRegOpnd();
        }

        tempIndirOpnd = IR::IndirOpnd::New(strPtr, tempReg, 1, TyUint16, func);
    }

    // By this point, we have added instructions before labelCharCodeAt to check for extra length required for the surrogate pair
    // The branching for that is already handled, all we have to do now is to check for correct values.
    // Validate char is in range [D800, DBFF]; otherwise just get a charCodeAt
    InsertCompareBranch(lowerChar, IR::IntConstOpnd::New(0xDC00, TyUint32, func), Js::OpCode::BrGe_A, labelCharCodeAt, lastInstr);
    InsertCompareBranch(lowerChar, IR::IntConstOpnd::New(0xD7FF, TyUint32, func), Js::OpCode::BrLe_A, labelCharCodeAt, lastInstr);

    // upperChar      = MOVZX r3, [r1 + r3 * 2]  -- this is the value of the upper surrogate pair char
    IR::RegOpnd *upperChar = IR::RegOpnd::New(TyInt32, func);
    InsertMove(upperChar, tempIndirOpnd, lastInstr);

    // Validate upper is in range [DC00, DFFF]; otherwise just get a charCodeAt
    InsertCompareBranch(upperChar, IR::IntConstOpnd::New(0xE000, TyUint32, func), Js::OpCode::BrGe_A, labelCharCodeAt, lastInstr);
    InsertCompareBranch(upperChar, IR::IntConstOpnd::New(0xDBFF, TyUint32, func), Js::OpCode::BrLe_A, labelCharCodeAt, lastInstr);

    // (lower - 0xD800) << 10 + second - 0xDC00 + 0x10000 -- 0x10000 - 0xDC00 = 0x2400
    // lowerChar      = SUB lowerChar - 0xD800
    // lowerChar      = SHL lowerChar, 10
    // lowerChar      = ADD lowerChar + upperChar
    // lowerChar      = ADD lowerChar + 0x2400
    InsertSub(false, lowerChar, lowerChar, IR::IntConstOpnd::New(0xD800, TyUint32, func), lastInstr);
    InsertShift(Js::OpCode::Shl_A, false, lowerChar, lowerChar, IR::IntConstOpnd::New(10, TyUint32, func), lastInstr);
    InsertAdd(false, lowerChar, lowerChar, upperChar, lastInstr);
    InsertAdd(false, lowerChar, lowerChar, IR::IntConstOpnd::New(0x2400, TyUint32, func), lastInstr);

    lastInstr->InsertBefore(labelCharCodeAt);
}